

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

ngx_int_t ngx_decode_base64_internal(ngx_str_t *dst,ngx_str_t *src,u_char *basis)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  
  uVar1 = src->len;
  if (uVar1 == 0) {
    pbVar2 = dst->data;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if ((ulong)src->data[uVar3] == 0x3d) break;
      if (basis[src->data[uVar3]] == 'M') {
        return -1;
      }
      uVar3 = uVar3 + 1;
      uVar4 = uVar1;
    } while (uVar1 != uVar3);
    if (((uint)uVar4 & 3) == 1) {
      return -1;
    }
    pbVar5 = src->data;
    pbVar2 = dst->data;
    for (; 3 < uVar4; uVar4 = uVar4 - 4) {
      *pbVar2 = basis[pbVar5[1]] >> 4 | basis[*pbVar5] << 2;
      pbVar2[1] = basis[pbVar5[2]] >> 2 | basis[pbVar5[1]] << 4;
      pbVar2[2] = basis[pbVar5[2]] << 6 | basis[pbVar5[3]];
      pbVar2 = pbVar2 + 3;
      pbVar5 = pbVar5 + 4;
    }
    if (1 < uVar4) {
      *pbVar2 = basis[pbVar5[1]] >> 4 | basis[*pbVar5] << 2;
      if (uVar4 == 3) {
        pbVar2[1] = basis[pbVar5[2]] >> 2 | basis[pbVar5[1]] << 4;
        pbVar2 = pbVar2 + 2;
      }
      else {
        pbVar2 = pbVar2 + 1;
      }
    }
  }
  dst->len = (long)pbVar2 - (long)dst->data;
  return 0;
}

Assistant:

static ngx_int_t
ngx_decode_base64_internal(ngx_str_t *dst, ngx_str_t *src, const u_char *basis)
{
    size_t          len;
    u_char         *d, *s;

    for (len = 0; len < src->len; len++) {
        if (src->data[len] == '=') {
            break;
        }

        if (basis[src->data[len]] == 77) {
            return NGX_ERROR;
        }
    }

    if (len % 4 == 1) {
        return NGX_ERROR;
    }

    s = src->data;
    d = dst->data;

    while (len > 3) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
        *d++ = (u_char) (basis[s[2]] << 6 | basis[s[3]]);

        s += 4;
        len -= 4;
    }

    if (len > 1) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
    }

    if (len > 2) {
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
    }

    dst->len = d - dst->data;

    return NGX_OK;
}